

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O0

optional<jbcoin::detail::STVar> *
jbcoin::STParsedJSONDetail::parseLeaf
          (optional<jbcoin::detail::STVar> *__return_storage_ptr__,string *json_name,
          string *fieldName,SField *name,Value *value,Value *error)

{
  SField *pSVar1;
  string *object;
  bool bVar2;
  Int IVar3;
  UInt UVar4;
  TxType TVar5;
  LedgerEntryType LVar6;
  ulong uVar7;
  char *pcVar8;
  reference_type pTVar9;
  KnownFormats<jbcoin::TxType> *this;
  KnownFormats<jbcoin::LedgerEntryType> *this_00;
  Value *pVVar10;
  ostream *poVar11;
  Value *this_01;
  reference_const_type pbVar12;
  SField *args;
  uint *args_1;
  STAmount *args_00;
  STVector256 *args_01;
  STPathSet *args_02;
  string *s_00;
  string *s_01;
  string *s_02;
  Value local_15a0 [2];
  exception *anon_var_0_11;
  Value local_1518;
  undefined1 local_1508 [8];
  optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> account_1;
  string strValue_2;
  exception *anon_var_0_10;
  allocator local_1441;
  string local_1440;
  Value local_1420;
  string local_1410;
  undefined1 local_13f0 [8];
  optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> a_1;
  allocator local_13b1;
  string local_13b0;
  Value local_1390;
  allocator local_1379;
  string local_1378;
  Value local_1358;
  string local_1348;
  string local_1328;
  allocator local_1301;
  string local_1300;
  Value local_12e0;
  allocator local_12c9;
  string local_12c8;
  Value local_12a8;
  string local_1298;
  undefined1 local_1278 [8];
  optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> a;
  allocator local_1239;
  string local_1238;
  Value local_1218;
  undefined1 local_1208 [8];
  Currency uCurrency;
  AccountID uIssuer;
  AccountID uAccount;
  bool hasCurrency;
  Value *issuer;
  Value *currency;
  Value *account;
  undefined1 local_11a0 [8];
  Value pathEl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1170;
  undefined1 local_1150 [8];
  string element_name;
  stringstream ss_1;
  ostream local_1120;
  UInt local_fa4;
  undefined1 local_fa0 [4];
  UInt j;
  Value local_f80;
  stringstream local_f70 [8];
  stringstream ss;
  ostream local_f60;
  undefined1 local_de8 [8];
  STPath p;
  undefined1 local_dc8 [4];
  UInt i_1;
  STPathSet tail_1;
  exception *anon_var_0_9;
  string local_d18;
  undefined1 local_cf4 [8];
  uint256 s;
  UInt i;
  STVector256 tail;
  exception *anon_var_0_8;
  STVar local_c38;
  exception *anon_var_0_7;
  uchar *local_bb0;
  STVar local_ba8;
  string local_b40;
  undefined1 local_b20 [8];
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> vBlob;
  exception *anon_var_0_6;
  undefined1 local_ac8 [160];
  exception *anon_var_0_5;
  undefined1 local_a18 [160];
  exception *anon_var_0_4;
  undefined1 local_968 [152];
  exception *anon_var_0_3;
  undefined1 local_8c0 [112];
  undefined1 local_850 [112];
  string local_7e0;
  undefined1 local_7c0 [128];
  exception *anon_var_0_2;
  undefined1 local_72c [112];
  undefined1 local_6bc [108];
  string local_650;
  undefined1 local_62c [124];
  exception *anon_var_0_1;
  undefined1 local_59a [112];
  undefined1 local_52a [106];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_49a [106];
  Value local_430;
  undefined1 local_41a [106];
  string local_3b0;
  LedgerEntryType local_390;
  undefined1 local_38a [2];
  LedgerEntryType type;
  string local_320;
  TxType local_2fc;
  undefined1 local_2f8 [4];
  TxType txType;
  string strValue_1;
  exception *anon_var_0;
  undefined1 local_2a9 [105];
  Value local_240;
  undefined1 local_229 [105];
  Value local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_189 [105];
  Value local_120;
  undefined1 local_109 [97];
  Value local_a8;
  type local_98;
  optional<jbcoin::TER> ter;
  string strValue;
  undefined1 local_68 [2];
  uchar maxValue;
  uchar minValue;
  SField *local_48;
  SField *field;
  Value *local_38;
  Value *error_local;
  Value *value_local;
  SField *name_local;
  string *fieldName_local;
  string *json_name_local;
  optional<jbcoin::detail::STVar> *ret;
  
  field._7_1_ = 0;
  local_38 = error;
  error_local = value;
  value_local = (Value *)name;
  name_local = (SField *)fieldName;
  fieldName_local = json_name;
  json_name_local = (string *)__return_storage_ptr__;
  boost::optional<jbcoin::detail::STVar>::optional(__return_storage_ptr__);
  local_48 = SField::getField((string *)name_local);
  bVar2 = SField::operator==(local_48,(SField *)sfInvalid);
  if (bVar2) {
    unknown_field((STParsedJSONDetail *)local_68,fieldName_local,(string *)name_local);
    Json::Value::operator=(local_38,(Value *)local_68);
    Json::Value::~Value((Value *)local_68);
    field._7_1_ = 1;
    goto LAB_0031fa39;
  }
  args_1 = &switchD_0031cb6a::switchdataD_004658a0;
  switch(local_48->fieldType) {
  case STI_UINT16:
    bVar2 = Json::Value::isString(error_local);
    if (bVar2) {
      Json::Value::asString_abi_cxx11_((string *)local_2f8,error_local);
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) &&
         ((pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_2f8), *pcVar8 < '0' ||
          (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_2f8), '9' < *pcVar8)))) {
        bVar2 = SField::operator==(local_48,(SField *)sfTransactionType);
        if (bVar2) {
          this = &TxFormats::getInstance()->super_KnownFormats<jbcoin::TxType>;
          std::__cxx11::string::string((string *)&local_320,(string *)local_2f8);
          TVar5 = KnownFormats<jbcoin::TxType>::findTypeByName(this,&local_320);
          std::__cxx11::string::~string((string *)&local_320);
          local_2fc._0_2_ = (undefined2)TVar5;
          local_38a = (undefined1  [2])(undefined2)local_2fc;
          local_2fc = TVar5;
          jbcoin::detail::
          make_stvar<jbcoin::STInteger<unsigned_short>,jbcoin::SField_const&,unsigned_short>
                    ((STVar *)&type,(detail *)local_48,(SField *)local_38a,(unsigned_short *)args_1)
          ;
          boost::optional<jbcoin::detail::STVar>::operator=(__return_storage_ptr__,(STVar *)&type);
          jbcoin::detail::STVar::~STVar((STVar *)&type);
          bVar2 = SField::operator==((SField *)value_local,(SField *)sfGeneric);
          if (bVar2) {
            value_local = (Value *)sfTransaction;
          }
          goto LAB_0031d542;
        }
        bVar2 = SField::operator==(local_48,(SField *)sfLedgerEntryType);
        if (bVar2) {
          this_00 = &LedgerFormats::getInstance()->super_KnownFormats<jbcoin::LedgerEntryType>;
          std::__cxx11::string::string((string *)&local_3b0,(string *)local_2f8);
          LVar6 = KnownFormats<jbcoin::LedgerEntryType>::findTypeByName(this_00,&local_3b0);
          std::__cxx11::string::~string((string *)&local_3b0);
          local_390._0_2_ = (undefined2)LVar6;
          local_41a._0_2_ = (undefined2)local_390;
          local_390 = LVar6;
          jbcoin::detail::
          make_stvar<jbcoin::STInteger<unsigned_short>,jbcoin::SField_const&,unsigned_short>
                    ((STVar *)(local_41a + 2),(detail *)local_48,(SField *)local_41a,
                     (unsigned_short *)args_1);
          boost::optional<jbcoin::detail::STVar>::operator=
                    (__return_storage_ptr__,(STVar *)(local_41a + 2));
          jbcoin::detail::STVar::~STVar((STVar *)(local_41a + 2));
          bVar2 = SField::operator==((SField *)value_local,(SField *)sfGeneric);
          if (bVar2) {
            value_local = (Value *)sfLedgerEntry;
          }
          goto LAB_0031d542;
        }
        invalid_data((STParsedJSONDetail *)&local_430,fieldName_local,(string *)name_local);
        Json::Value::operator=(local_38,&local_430);
        Json::Value::~Value(&local_430);
        field._7_1_ = 1;
        bVar2 = true;
      }
      else {
        pSVar1 = local_48;
        std::__cxx11::string::string((string *)&local_4c0,(string *)local_2f8);
        local_49a._0_2_ = beast::lexicalCastThrow<unsigned_short,std::__cxx11::string>(&local_4c0);
        jbcoin::detail::
        make_stvar<jbcoin::STInteger<unsigned_short>,jbcoin::SField_const&,unsigned_short>
                  ((STVar *)(local_49a + 2),(detail *)pSVar1,(SField *)local_49a,
                   (unsigned_short *)args_1);
        boost::optional<jbcoin::detail::STVar>::operator=
                  (__return_storage_ptr__,(STVar *)(local_49a + 2));
        jbcoin::detail::STVar::~STVar((STVar *)(local_49a + 2));
        std::__cxx11::string::~string((string *)&local_4c0);
LAB_0031d542:
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)local_2f8);
      if (bVar2) goto LAB_0031fa39;
    }
    else {
      bVar2 = Json::Value::isInt(error_local);
      pSVar1 = local_48;
      if (bVar2) {
        IVar3 = Json::Value::asInt(error_local);
        local_52a._0_2_ = to_unsigned<unsigned_short,int>(IVar3);
        jbcoin::detail::
        make_stvar<jbcoin::STInteger<unsigned_short>,jbcoin::SField_const&,unsigned_short>
                  ((STVar *)(local_52a + 2),(detail *)pSVar1,(SField *)local_52a,
                   (unsigned_short *)args_1);
        boost::optional<jbcoin::detail::STVar>::operator=
                  (__return_storage_ptr__,(STVar *)(local_52a + 2));
        jbcoin::detail::STVar::~STVar((STVar *)(local_52a + 2));
      }
      else {
        bVar2 = Json::Value::isUInt(error_local);
        pSVar1 = local_48;
        if (!bVar2) {
          bad_type((STParsedJSONDetail *)&anon_var_0_1,fieldName_local,(string *)name_local);
          Json::Value::operator=(local_38,(Value *)&anon_var_0_1);
          Json::Value::~Value((Value *)&anon_var_0_1);
          field._7_1_ = 1;
          goto LAB_0031fa39;
        }
        UVar4 = Json::Value::asUInt(error_local);
        local_59a._0_2_ = to_unsigned<unsigned_short,unsigned_int>(UVar4);
        jbcoin::detail::
        make_stvar<jbcoin::STInteger<unsigned_short>,jbcoin::SField_const&,unsigned_short>
                  ((STVar *)(local_59a + 2),(detail *)pSVar1,(SField *)local_59a,
                   (unsigned_short *)args_1);
        boost::optional<jbcoin::detail::STVar>::operator=
                  (__return_storage_ptr__,(STVar *)(local_59a + 2));
        jbcoin::detail::STVar::~STVar((STVar *)(local_59a + 2));
      }
    }
    break;
  case STI_UINT32:
    bVar2 = Json::Value::isString(error_local);
    pSVar1 = local_48;
    if (bVar2) {
      Json::Value::asString_abi_cxx11_(&local_650,error_local);
      local_62c._0_4_ = beast::lexicalCastThrow<unsigned_int,std::__cxx11::string>(&local_650);
      jbcoin::detail::make_stvar<jbcoin::STInteger<unsigned_int>,jbcoin::SField_const&,unsigned_int>
                ((STVar *)(local_62c + 4),(detail *)pSVar1,(SField *)local_62c,args_1);
      boost::optional<jbcoin::detail::STVar>::operator=
                (__return_storage_ptr__,(STVar *)(local_62c + 4));
      jbcoin::detail::STVar::~STVar((STVar *)(local_62c + 4));
      std::__cxx11::string::~string((string *)&local_650);
    }
    else {
      bVar2 = Json::Value::isInt(error_local);
      pSVar1 = local_48;
      if (bVar2) {
        IVar3 = Json::Value::asInt(error_local);
        local_6bc._0_4_ = to_unsigned<unsigned_int,int>(IVar3);
        jbcoin::detail::
        make_stvar<jbcoin::STInteger<unsigned_int>,jbcoin::SField_const&,unsigned_int>
                  ((STVar *)(local_6bc + 4),(detail *)pSVar1,(SField *)local_6bc,args_1);
        boost::optional<jbcoin::detail::STVar>::operator=
                  (__return_storage_ptr__,(STVar *)(local_6bc + 4));
        jbcoin::detail::STVar::~STVar((STVar *)(local_6bc + 4));
      }
      else {
        bVar2 = Json::Value::isUInt(error_local);
        pSVar1 = local_48;
        if (!bVar2) {
          bad_type((STParsedJSONDetail *)&anon_var_0_2,fieldName_local,(string *)name_local);
          Json::Value::operator=(local_38,(Value *)&anon_var_0_2);
          Json::Value::~Value((Value *)&anon_var_0_2);
          field._7_1_ = 1;
          goto LAB_0031fa39;
        }
        local_72c._0_4_ = Json::Value::asUInt(error_local);
        jbcoin::detail::
        make_stvar<jbcoin::STInteger<unsigned_int>,jbcoin::SField_const&,unsigned_int>
                  ((STVar *)(local_72c + 4),(detail *)pSVar1,(SField *)local_72c,args_1);
        boost::optional<jbcoin::detail::STVar>::operator=
                  (__return_storage_ptr__,(STVar *)(local_72c + 4));
        jbcoin::detail::STVar::~STVar((STVar *)(local_72c + 4));
      }
    }
    break;
  case STI_UINT64:
    bVar2 = Json::Value::isString(error_local);
    pSVar1 = local_48;
    if (bVar2) {
      Json::Value::asString_abi_cxx11_(&local_7e0,error_local);
      local_7c0._0_8_ = uintFromHex(&local_7e0);
      jbcoin::detail::
      make_stvar<jbcoin::STInteger<unsigned_long>,jbcoin::SField_const&,unsigned_long>
                ((STVar *)(local_7c0 + 8),(detail *)pSVar1,(SField *)local_7c0,
                 (unsigned_long *)args_1);
      boost::optional<jbcoin::detail::STVar>::operator=
                (__return_storage_ptr__,(STVar *)(local_7c0 + 8));
      jbcoin::detail::STVar::~STVar((STVar *)(local_7c0 + 8));
      std::__cxx11::string::~string((string *)&local_7e0);
    }
    else {
      bVar2 = Json::Value::isInt(error_local);
      pSVar1 = local_48;
      if (bVar2) {
        IVar3 = Json::Value::asInt(error_local);
        local_850._0_8_ = to_unsigned<unsigned_long,int>(IVar3);
        jbcoin::detail::
        make_stvar<jbcoin::STInteger<unsigned_long>,jbcoin::SField_const&,unsigned_long>
                  ((STVar *)(local_850 + 8),(detail *)pSVar1,(SField *)local_850,
                   (unsigned_long *)args_1);
        boost::optional<jbcoin::detail::STVar>::operator=
                  (__return_storage_ptr__,(STVar *)(local_850 + 8));
        jbcoin::detail::STVar::~STVar((STVar *)(local_850 + 8));
      }
      else {
        bVar2 = Json::Value::isUInt(error_local);
        pSVar1 = local_48;
        if (!bVar2) {
          bad_type((STParsedJSONDetail *)&anon_var_0_3,fieldName_local,(string *)name_local);
          Json::Value::operator=(local_38,(Value *)&anon_var_0_3);
          Json::Value::~Value((Value *)&anon_var_0_3);
          field._7_1_ = 1;
          goto LAB_0031fa39;
        }
        UVar4 = Json::Value::asUInt(error_local);
        local_8c0._0_8_ = ZEXT48(UVar4);
        jbcoin::detail::
        make_stvar<jbcoin::STInteger<unsigned_long>,jbcoin::SField_const&,unsigned_long>
                  ((STVar *)(local_8c0 + 8),(detail *)pSVar1,(SField *)local_8c0,
                   (unsigned_long *)args_1);
        boost::optional<jbcoin::detail::STVar>::operator=
                  (__return_storage_ptr__,(STVar *)(local_8c0 + 8));
        jbcoin::detail::STVar::~STVar((STVar *)(local_8c0 + 8));
      }
    }
    break;
  case STI_HASH128:
    bVar2 = Json::Value::isString(error_local);
    pSVar1 = local_48;
    if (!bVar2) {
      bad_type((STParsedJSONDetail *)&anon_var_0_4,fieldName_local,(string *)name_local);
      Json::Value::operator=(local_38,(Value *)&anon_var_0_4);
      Json::Value::~Value((Value *)&anon_var_0_4);
      field._7_1_ = 1;
      goto LAB_0031fa39;
    }
    Json::Value::asString_abi_cxx11_((string *)local_968,error_local);
    jbcoin::detail::
    make_stvar<jbcoin::STBitString<128ul>,jbcoin::SField_const&,std::__cxx11::string>
              ((STVar *)(local_968 + 0x20),(detail *)pSVar1,(SField *)local_968,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
    boost::optional<jbcoin::detail::STVar>::operator=
              (__return_storage_ptr__,(STVar *)(local_968 + 0x20));
    jbcoin::detail::STVar::~STVar((STVar *)(local_968 + 0x20));
    std::__cxx11::string::~string((string *)local_968);
    break;
  case STI_HASH256:
    bVar2 = Json::Value::isString(error_local);
    pSVar1 = local_48;
    if (!bVar2) {
      bad_type((STParsedJSONDetail *)&anon_var_0_6,fieldName_local,(string *)name_local);
      Json::Value::operator=(local_38,(Value *)&anon_var_0_6);
      Json::Value::~Value((Value *)&anon_var_0_6);
      field._7_1_ = 1;
      goto LAB_0031fa39;
    }
    Json::Value::asString_abi_cxx11_((string *)local_ac8,error_local);
    jbcoin::detail::
    make_stvar<jbcoin::STBitString<256ul>,jbcoin::SField_const&,std::__cxx11::string>
              ((STVar *)(local_ac8 + 0x20),(detail *)pSVar1,(SField *)local_ac8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
    boost::optional<jbcoin::detail::STVar>::operator=
              (__return_storage_ptr__,(STVar *)(local_ac8 + 0x20));
    jbcoin::detail::STVar::~STVar((STVar *)(local_ac8 + 0x20));
    std::__cxx11::string::~string((string *)local_ac8);
    break;
  case STI_AMOUNT:
    amountFromJson((STAmount *)&anon_var_0_8,local_48,error_local);
    jbcoin::detail::make_stvar<jbcoin::STAmount,jbcoin::STAmount>
              (&local_c38,(detail *)&anon_var_0_8,args_00);
    boost::optional<jbcoin::detail::STVar>::operator=(__return_storage_ptr__,&local_c38);
    jbcoin::detail::STVar::~STVar(&local_c38);
    jbcoin::STAmount::~STAmount((STAmount *)&anon_var_0_8);
    break;
  case STI_VL:
    bVar2 = Json::Value::isString(error_local);
    if (!bVar2) {
      bad_type((STParsedJSONDetail *)&vBlob.second,fieldName_local,(string *)name_local);
      Json::Value::operator=(local_38,(Value *)&vBlob.second);
      Json::Value::~Value((Value *)&vBlob.second);
      field._7_1_ = 1;
      goto LAB_0031fa39;
    }
    Json::Value::asString_abi_cxx11_(&local_b40,error_local);
    strUnHex((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> *)local_b20,
             &local_b40);
    std::__cxx11::string::~string((string *)&local_b40);
    pSVar1 = local_48;
    if (((byte)vBlob.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage & 1) == 0) {
      Throw<std::invalid_argument,char_const(&)[13]>((char (*) [13])"invalid data");
    }
    local_bb0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b20);
    anon_var_0_7 = (exception *)
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b20);
    jbcoin::detail::make_stvar<jbcoin::STBlob,jbcoin::SField_const&,unsigned_char*,unsigned_long>
              (&local_ba8,(detail *)pSVar1,(SField *)&local_bb0,(uchar **)&anon_var_0_7,
               (unsigned_long *)value);
    boost::optional<jbcoin::detail::STVar>::operator=(__return_storage_ptr__,&local_ba8);
    jbcoin::detail::STVar::~STVar(&local_ba8);
    std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool>::~pair
              ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> *)local_b20);
    break;
  case STI_ACCOUNT:
    bVar2 = Json::Value::isString(error_local);
    if (!bVar2) {
      bad_type((STParsedJSONDetail *)(strValue_2.field_2._M_local_buf + 8),fieldName_local,
               (string *)name_local);
      Json::Value::operator=(local_38,(Value *)((long)&strValue_2.field_2 + 8));
      Json::Value::~Value((Value *)((long)&strValue_2.field_2 + 8));
      field._7_1_ = 1;
      goto LAB_0031fa39;
    }
    Json::Value::asString_abi_cxx11_
              ((string *)((long)&account_1.super_type.m_storage.dummy_ + 0xc),error_local);
    parseHexOrBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
              ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)local_1508,
               (jbcoin *)(account_1.super_type.m_storage.dummy_.data + 0xc),s_02);
    strValue.field_2._M_local_buf[0xc] =
         boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>::operator!
                   ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)local_1508)
    ;
    pSVar1 = local_48;
    if ((bool)strValue.field_2._M_local_buf[0xc]) {
      invalid_data((STParsedJSONDetail *)&local_1518,fieldName_local,(string *)name_local);
      Json::Value::operator=(local_38,&local_1518);
      Json::Value::~Value(&local_1518);
      field._7_1_ = 1;
    }
    else {
      args = (SField *)
             boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>::operator*
                       ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                        local_1508);
      jbcoin::detail::
      make_stvar<jbcoin::STAccount,jbcoin::SField_const&,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>const&>
                ((STVar *)&anon_var_0_11,(detail *)pSVar1,args,
                 (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)args_1);
      boost::optional<jbcoin::detail::STVar>::operator=
                (__return_storage_ptr__,(STVar *)&anon_var_0_11);
      jbcoin::detail::STVar::~STVar((STVar *)&anon_var_0_11);
    }
    strValue.field_2._13_3_ = 0;
    boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>::~optional
              ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)local_1508);
    if (strValue.field_2._12_4_ == 0) {
      strValue.field_2._12_4_ = 0;
    }
    std::__cxx11::string::~string((string *)(account_1.super_type.m_storage.dummy_.data + 0xc));
    goto joined_r0x0031f6d5;
  default:
    bad_type((STParsedJSONDetail *)local_15a0,fieldName_local,(string *)name_local);
    Json::Value::operator=(local_38,local_15a0);
    Json::Value::~Value(local_15a0);
    field._7_1_ = 1;
    goto LAB_0031fa39;
  case STI_UINT8:
    bVar2 = Json::Value::isString(error_local);
    if (bVar2) {
      Json::Value::asString_abi_cxx11_((string *)&ter,error_local);
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) &&
         ((pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&ter), *pcVar8 < '0' ||
          (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&ter), '9' < *pcVar8)))) {
        bVar2 = SField::operator==(local_48,(SField *)sfTransactionResult);
        if (bVar2) {
          local_98 = (type)transCode((string *)&ter);
          bVar2 = boost::optional<jbcoin::TER>::operator!((optional<jbcoin::TER> *)&local_98);
          if (((!bVar2) &&
              (pTVar9 = boost::optional<jbcoin::TER>::operator*((optional<jbcoin::TER> *)&local_98),
              ~tesSUCCESS < *pTVar9)) &&
             (pTVar9 = boost::optional<jbcoin::TER>::operator*((optional<jbcoin::TER> *)&local_98),
             pSVar1 = local_48, *pTVar9 < 0x100)) {
            pTVar9 = boost::optional<jbcoin::TER>::operator*((optional<jbcoin::TER> *)&local_98);
            local_109[0] = (undefined1)*pTVar9;
            jbcoin::detail::
            make_stvar<jbcoin::STInteger<unsigned_char>,jbcoin::SField_const&,unsigned_char>
                      ((STVar *)(local_109 + 1),(detail *)pSVar1,(SField *)local_109,(uchar *)args_1
                      );
            boost::optional<jbcoin::detail::STVar>::operator=
                      (__return_storage_ptr__,(STVar *)(local_109 + 1));
            jbcoin::detail::STVar::~STVar((STVar *)(local_109 + 1));
            goto LAB_0031ce66;
          }
          out_of_range((STParsedJSONDetail *)&local_a8,fieldName_local,(string *)name_local);
          Json::Value::operator=(local_38,&local_a8);
          Json::Value::~Value(&local_a8);
          field._7_1_ = 1;
          bVar2 = true;
        }
        else {
          bad_type((STParsedJSONDetail *)&local_120,fieldName_local,(string *)name_local);
          Json::Value::operator=(local_38,&local_120);
          Json::Value::~Value(&local_120);
          field._7_1_ = 1;
          bVar2 = true;
        }
      }
      else {
        pSVar1 = local_48;
        std::__cxx11::string::string((string *)&local_1b0,(string *)&ter);
        local_189[0] = beast::lexicalCastThrow<unsigned_char,std::__cxx11::string>(&local_1b0);
        jbcoin::detail::
        make_stvar<jbcoin::STInteger<unsigned_char>,jbcoin::SField_const&,unsigned_char>
                  ((STVar *)(local_189 + 1),(detail *)pSVar1,(SField *)local_189,(uchar *)args_1);
        boost::optional<jbcoin::detail::STVar>::operator=
                  (__return_storage_ptr__,(STVar *)(local_189 + 1));
        jbcoin::detail::STVar::~STVar((STVar *)(local_189 + 1));
        std::__cxx11::string::~string((string *)&local_1b0);
LAB_0031ce66:
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&ter);
      if (bVar2) goto LAB_0031fa39;
    }
    else {
      bVar2 = Json::Value::isInt(error_local);
      if (bVar2) {
        IVar3 = Json::Value::asInt(error_local);
        if ((IVar3 < 0) ||
           (IVar3 = Json::Value::asInt(error_local), pSVar1 = local_48, 0xff < IVar3)) {
          out_of_range((STParsedJSONDetail *)&local_1c0,fieldName_local,(string *)name_local);
          Json::Value::operator=(local_38,&local_1c0);
          Json::Value::~Value(&local_1c0);
          field._7_1_ = 1;
          goto LAB_0031fa39;
        }
        IVar3 = Json::Value::asInt(error_local);
        local_229[0] = (undefined1)IVar3;
        jbcoin::detail::
        make_stvar<jbcoin::STInteger<unsigned_char>,jbcoin::SField_const&,unsigned_char>
                  ((STVar *)(local_229 + 1),(detail *)pSVar1,(SField *)local_229,(uchar *)args_1);
        boost::optional<jbcoin::detail::STVar>::operator=
                  (__return_storage_ptr__,(STVar *)(local_229 + 1));
        jbcoin::detail::STVar::~STVar((STVar *)(local_229 + 1));
      }
      else {
        bVar2 = Json::Value::isUInt(error_local);
        if (!bVar2) {
          bad_type((STParsedJSONDetail *)&anon_var_0,fieldName_local,(string *)name_local);
          Json::Value::operator=(local_38,(Value *)&anon_var_0);
          Json::Value::~Value((Value *)&anon_var_0);
          field._7_1_ = 1;
          goto LAB_0031fa39;
        }
        UVar4 = Json::Value::asUInt(error_local);
        pSVar1 = local_48;
        if (0xff < UVar4) {
          out_of_range((STParsedJSONDetail *)&local_240,fieldName_local,(string *)name_local);
          Json::Value::operator=(local_38,&local_240);
          Json::Value::~Value(&local_240);
          field._7_1_ = 1;
          goto LAB_0031fa39;
        }
        UVar4 = Json::Value::asUInt(error_local);
        local_2a9[0] = (undefined1)UVar4;
        jbcoin::detail::
        make_stvar<jbcoin::STInteger<unsigned_char>,jbcoin::SField_const&,unsigned_char>
                  ((STVar *)(local_2a9 + 1),(detail *)pSVar1,(SField *)local_2a9,(uchar *)args_1);
        boost::optional<jbcoin::detail::STVar>::operator=
                  (__return_storage_ptr__,(STVar *)(local_2a9 + 1));
        jbcoin::detail::STVar::~STVar((STVar *)(local_2a9 + 1));
      }
    }
    break;
  case STI_HASH160:
    bVar2 = Json::Value::isString(error_local);
    pSVar1 = local_48;
    if (!bVar2) {
      bad_type((STParsedJSONDetail *)&anon_var_0_5,fieldName_local,(string *)name_local);
      Json::Value::operator=(local_38,(Value *)&anon_var_0_5);
      Json::Value::~Value((Value *)&anon_var_0_5);
      field._7_1_ = 1;
      goto LAB_0031fa39;
    }
    Json::Value::asString_abi_cxx11_((string *)local_a18,error_local);
    jbcoin::detail::
    make_stvar<jbcoin::STBitString<160ul>,jbcoin::SField_const&,std::__cxx11::string>
              ((STVar *)(local_a18 + 0x20),(detail *)pSVar1,(SField *)local_a18,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
    boost::optional<jbcoin::detail::STVar>::operator=
              (__return_storage_ptr__,(STVar *)(local_a18 + 0x20));
    jbcoin::detail::STVar::~STVar((STVar *)(local_a18 + 0x20));
    std::__cxx11::string::~string((string *)local_a18);
    break;
  case STI_PATHSET:
    bVar2 = Json::Value::isArray(error_local);
    if (!bVar2) {
      array_expected((STParsedJSONDetail *)
                     &tail_1.value.
                      super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,fieldName_local,(string *)name_local
                    );
      Json::Value::operator=
                (local_38,(Value *)&tail_1.value.
                                    super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Json::Value::~Value((Value *)&tail_1.value.
                                    super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      field._7_1_ = 1;
      goto LAB_0031fa39;
    }
    STPathSet::STPathSet((STPathSet *)local_dc8,local_48);
    p.mPath.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    while (bVar2 = Json::Value::isValidIndex
                             (error_local,
                              p.mPath.
                              super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_), bVar2) {
      STPath::STPath((STPath *)local_de8);
      pVVar10 = Json::Value::operator[]
                          (error_local,
                           p.mPath.
                           super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      bVar2 = Json::Value::isArray(pVVar10);
      if (bVar2) {
        local_fa4 = 0;
        while( true ) {
          pVVar10 = Json::Value::operator[]
                              (error_local,
                               p.mPath.
                               super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          bVar2 = Json::Value::isValidIndex(pVVar10,local_fa4);
          if (!bVar2) break;
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)(element_name.field_2._M_local_buf + 8));
          poVar11 = std::operator<<(&local_1120,(string *)name_local);
          poVar11 = std::operator<<(poVar11,"[");
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              (poVar11,p.mPath.
                                       super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          poVar11 = std::operator<<(poVar11,"][");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_fa4);
          std::operator<<(poVar11,"]");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1170,(char *)fieldName_local);
          std::__cxx11::stringstream::str();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1150,&local_1170,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pathEl.field_0x8);
          std::__cxx11::string::~string((string *)&pathEl.field_0x8);
          std::__cxx11::string::~string((string *)&local_1170);
          pVVar10 = Json::Value::operator[]
                              (error_local,
                               p.mPath.
                               super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pVVar10 = Json::Value::operator[](pVVar10,local_fa4);
          Json::Value::Value((Value *)local_11a0,pVVar10);
          bVar2 = Json::Value::isObject((Value *)local_11a0);
          if (bVar2) {
            pVVar10 = Json::Value::operator[]((Value *)local_11a0,"account");
            this_01 = Json::Value::operator[]((Value *)local_11a0,"currency");
            register0x00000000 = Json::Value::operator[]((Value *)local_11a0,"issuer");
            uAccount.pn[3]._3_1_ = 0;
            base_uint<160UL,_jbcoin::detail::AccountIDTag>::base_uint
                      ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(uIssuer.pn + 3));
            base_uint<160UL,_jbcoin::detail::AccountIDTag>::base_uint
                      ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(uCurrency.pn + 3));
            base_uint<160UL,_jbcoin::detail::CurrencyTag>::base_uint
                      ((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)local_1208);
            bVar2 = Json::Value::operator_cast_to_bool(pVVar10);
            if (bVar2) {
              bVar2 = Json::Value::isString(pVVar10);
              if (!bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_1238,"account",&local_1239);
                string_expected((STParsedJSONDetail *)&local_1218,(string *)local_1150,&local_1238);
                Json::Value::operator=(local_38,&local_1218);
                Json::Value::~Value(&local_1218);
                std::__cxx11::string::~string((string *)&local_1238);
                std::allocator<char>::~allocator((allocator<char> *)&local_1239);
                field._7_1_ = 1;
                strValue.field_2._12_4_ = 1;
                goto LAB_0031f5c6;
              }
              Json::Value::asString_abi_cxx11_
                        ((string *)((long)&a.super_type.m_storage.dummy_ + 0xc),pVVar10);
              bVar2 = base_uint<160UL,_jbcoin::detail::AccountIDTag>::SetHexExact
                                ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(uIssuer.pn + 3),
                                 (string *)((long)&a.super_type.m_storage.dummy_ + 0xc));
              std::__cxx11::string::~string((string *)(a.super_type.m_storage.dummy_.data + 0xc));
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                Json::Value::asString_abi_cxx11_(&local_1298,pVVar10);
                parseBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
                          ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                           local_1278,(jbcoin *)&local_1298,s_00);
                std::__cxx11::string::~string((string *)&local_1298);
                strValue.field_2._M_local_buf[0xc] =
                     boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>::
                     operator!((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                               local_1278);
                if ((bool)strValue.field_2._M_local_buf[0xc]) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_12c8,"account",&local_12c9);
                  invalid_data((STParsedJSONDetail *)&local_12a8,(string *)local_1150,&local_12c8);
                  Json::Value::operator=(local_38,&local_12a8);
                  Json::Value::~Value(&local_12a8);
                  std::__cxx11::string::~string((string *)&local_12c8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_12c9);
                  field._7_1_ = 1;
                }
                else {
                  pbVar12 = boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>
                            ::operator*((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>
                                         *)local_1278);
                  base_uint<160UL,_jbcoin::detail::AccountIDTag>::operator=
                            ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(uIssuer.pn + 3),
                             pbVar12);
                }
                strValue.field_2._13_3_ = 0;
                boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>::~optional
                          ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                           local_1278);
                if (strValue.field_2._12_4_ != 0) goto LAB_0031f5c6;
              }
            }
            bVar2 = Json::Value::operator_cast_to_bool(this_01);
            if (bVar2) {
              bVar2 = Json::Value::isString(this_01);
              if (!bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_1300,"currency",&local_1301);
                string_expected((STParsedJSONDetail *)&local_12e0,(string *)local_1150,&local_1300);
                Json::Value::operator=(local_38,&local_12e0);
                Json::Value::~Value(&local_12e0);
                std::__cxx11::string::~string((string *)&local_1300);
                std::allocator<char>::~allocator((allocator<char> *)&local_1301);
                field._7_1_ = 1;
                strValue.field_2._12_4_ = 1;
                goto LAB_0031f5c6;
              }
              uAccount.pn[3]._3_1_ = 1;
              Json::Value::asString_abi_cxx11_(&local_1328,this_01);
              bVar2 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::SetHexExact
                                ((base_uint<160UL,_jbcoin::detail::CurrencyTag> *)local_1208,
                                 &local_1328);
              std::__cxx11::string::~string((string *)&local_1328);
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                Json::Value::asString_abi_cxx11_(&local_1348,this_01);
                bVar2 = to_currency((Currency *)local_1208,&local_1348);
                std::__cxx11::string::~string((string *)&local_1348);
                if (((bVar2 ^ 0xffU) & 1) != 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_1378,"currency",&local_1379);
                  invalid_data((STParsedJSONDetail *)&local_1358,(string *)local_1150,&local_1378);
                  Json::Value::operator=(local_38,&local_1358);
                  Json::Value::~Value(&local_1358);
                  std::__cxx11::string::~string((string *)&local_1378);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1379);
                  field._7_1_ = 1;
                  strValue.field_2._12_4_ = 1;
                  goto LAB_0031f5c6;
                }
              }
            }
            bVar2 = Json::Value::operator_cast_to_bool(stack0xffffffffffffee38);
            if (bVar2) {
              bVar2 = Json::Value::isString(stack0xffffffffffffee38);
              if (!bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_13b0,"issuer",&local_13b1);
                string_expected((STParsedJSONDetail *)&local_1390,(string *)local_1150,&local_13b0);
                Json::Value::operator=(local_38,&local_1390);
                Json::Value::~Value(&local_1390);
                std::__cxx11::string::~string((string *)&local_13b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_13b1);
                field._7_1_ = 1;
                strValue.field_2._12_4_ = 1;
                goto LAB_0031f5c6;
              }
              Json::Value::asString_abi_cxx11_
                        ((string *)((long)&a_1.super_type.m_storage.dummy_ + 0xc),
                         stack0xffffffffffffee38);
              bVar2 = base_uint<160UL,_jbcoin::detail::AccountIDTag>::SetHexExact
                                ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)
                                 (uCurrency.pn + 3),
                                 (string *)((long)&a_1.super_type.m_storage.dummy_ + 0xc));
              std::__cxx11::string::~string((string *)(a_1.super_type.m_storage.dummy_.data + 0xc));
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                Json::Value::asString_abi_cxx11_(&local_1410,stack0xffffffffffffee38);
                parseBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
                          ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                           local_13f0,(jbcoin *)&local_1410,s_01);
                std::__cxx11::string::~string((string *)&local_1410);
                strValue.field_2._M_local_buf[0xc] =
                     boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>::
                     operator!((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                               local_13f0);
                if ((bool)strValue.field_2._M_local_buf[0xc]) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_1440,"issuer",&local_1441);
                  invalid_data((STParsedJSONDetail *)&local_1420,(string *)local_1150,&local_1440);
                  Json::Value::operator=(local_38,&local_1420);
                  Json::Value::~Value(&local_1420);
                  std::__cxx11::string::~string((string *)&local_1440);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1441);
                  field._7_1_ = 1;
                }
                else {
                  pbVar12 = boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>
                            ::operator*((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>
                                         *)local_13f0);
                  base_uint<160UL,_jbcoin::detail::AccountIDTag>::operator=
                            ((base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(uCurrency.pn + 3),
                             pbVar12);
                }
                strValue.field_2._13_3_ = 0;
                boost::optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>::~optional
                          ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                           local_13f0);
                if (strValue.field_2._12_4_ != 0) goto LAB_0031f5c6;
              }
            }
            STPath::
            emplace_back<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>&,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,bool&>
                      ((STPath *)local_de8,
                       (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(uIssuer.pn + 3),
                       (base_uint<160UL,_jbcoin::detail::CurrencyTag> *)local_1208,
                       (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)(uCurrency.pn + 3),
                       (bool *)((long)uAccount.pn + 0xf));
            strValue.field_2._12_4_ = 0;
          }
          else {
            not_an_object((STParsedJSONDetail *)&account,(string *)local_1150);
            Json::Value::operator=(local_38,(Value *)&account);
            Json::Value::~Value((Value *)&account);
            field._7_1_ = 1;
            strValue.field_2._12_4_ = 1;
          }
LAB_0031f5c6:
          Json::Value::~Value((Value *)local_11a0);
          std::__cxx11::string::~string((string *)local_1150);
          std::__cxx11::stringstream::~stringstream
                    ((stringstream *)(element_name.field_2._M_local_buf + 8));
          if (strValue.field_2._12_4_ != 0) goto LAB_0031f64b;
          local_fa4 = local_fa4 + 1;
        }
        STPathSet::push_back((STPathSet *)local_dc8,(STPath *)local_de8);
        strValue.field_2._12_4_ = 0;
      }
      else {
        std::__cxx11::stringstream::stringstream(local_f70);
        poVar11 = std::operator<<(&local_f60,(string *)name_local);
        poVar11 = std::operator<<(poVar11,"[");
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            (poVar11,p.mPath.
                                     super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        std::operator<<(poVar11,"]");
        object = fieldName_local;
        std::__cxx11::stringstream::str();
        array_expected((STParsedJSONDetail *)&local_f80,object,(string *)local_fa0);
        Json::Value::operator=(local_38,&local_f80);
        Json::Value::~Value(&local_f80);
        std::__cxx11::string::~string((string *)local_fa0);
        field._7_1_ = 1;
        strValue.field_2._12_4_ = 1;
        std::__cxx11::stringstream::~stringstream(local_f70);
      }
LAB_0031f64b:
      STPath::~STPath((STPath *)local_de8);
      if (strValue.field_2._12_4_ != 0) goto LAB_0031f6c4;
      p.mPath.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           p.mPath.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
    jbcoin::detail::make_stvar<jbcoin::STPathSet,jbcoin::STPathSet>
              ((STVar *)&anon_var_0_10,(detail *)local_dc8,args_02);
    boost::optional<jbcoin::detail::STVar>::operator=
              (__return_storage_ptr__,(STVar *)&anon_var_0_10);
    jbcoin::detail::STVar::~STVar((STVar *)&anon_var_0_10);
    strValue.field_2._12_4_ = 0;
LAB_0031f6c4:
    STPathSet::~STPathSet((STPathSet *)local_dc8);
joined_r0x0031f6d5:
    if (strValue.field_2._12_4_ != 0) goto LAB_0031fa39;
    break;
  case STI_VECTOR256:
    bVar2 = Json::Value::isArray(error_local);
    if (!bVar2) {
      array_expected((STParsedJSONDetail *)
                     &tail.mValue.
                      super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,fieldName_local,
                     (string *)name_local);
      Json::Value::operator=
                (local_38,(Value *)&tail.mValue.
                                    super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Json::Value::~Value((Value *)&tail.mValue.
                                    super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      field._7_1_ = 1;
      goto LAB_0031fa39;
    }
    STVector256::STVector256((STVector256 *)(s.pn + 7),local_48);
    s.pn[6] = 0;
    while (bVar2 = Json::Value::isValidIndex(error_local,s.pn[6]), bVar2) {
      base_uint<256UL,_void>::base_uint((base_uint<256UL,_void> *)local_cf4);
      pVVar10 = Json::Value::operator[](error_local,s.pn[6]);
      Json::Value::asString_abi_cxx11_(&local_d18,pVVar10);
      base_uint<256UL,_void>::SetHex((base_uint<256UL,_void> *)local_cf4,&local_d18,false);
      std::__cxx11::string::~string((string *)&local_d18);
      STVector256::push_back((STVector256 *)(s.pn + 7),(uint256 *)local_cf4);
      s.pn[6] = s.pn[6] + 1;
    }
    jbcoin::detail::make_stvar<jbcoin::STVector256,jbcoin::STVector256>
              ((STVar *)&anon_var_0_9,(detail *)(s.pn + 7),args_01);
    boost::optional<jbcoin::detail::STVar>::operator=(__return_storage_ptr__,(STVar *)&anon_var_0_9)
    ;
    jbcoin::detail::STVar::~STVar((STVar *)&anon_var_0_9);
    STVector256::~STVector256((STVector256 *)(s.pn + 7));
  }
  field._7_1_ = 1;
LAB_0031fa39:
  if ((field._7_1_ & 1) == 0) {
    boost::optional<jbcoin::detail::STVar>::~optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static boost::optional<detail::STVar> parseLeaf (
    std::string const& json_name,
    std::string const& fieldName,
    SField const* name,
    Json::Value const& value,
    Json::Value& error)
{
    boost::optional <detail::STVar> ret;

    auto const& field = SField::getField (fieldName);

    if (field == sfInvalid)
    {
        error = unknown_field (json_name, fieldName);
        return ret;
    }

    switch (field.fieldType)
    {
    case STI_UINT8:
        try
        {
            constexpr auto minValue = std::numeric_limits<std::uint8_t>::min();
            constexpr auto maxValue = std::numeric_limits<std::uint8_t>::max();
            if (value.isString ())
            {
                std::string const strValue = value.asString();

                if (!strValue.empty() &&
                    ((strValue[0] < '0') || (strValue[0] > '9')))
                {
                    if (field == sfTransactionResult)
                    {
                        auto ter = transCode(strValue);

                        if (!ter || *ter < minValue || *ter > maxValue)
                        {
                            error = out_of_range(json_name, fieldName);
                            return ret;
                        }

                        ret = detail::make_stvar<STUInt8>(field,
                            static_cast<std::uint8_t>(*ter));
                    }
                    else
                    {
                        error = bad_type(json_name, fieldName);
                        return ret;
                    }
                }
                else
                {
                    ret = detail::make_stvar <STUInt8>(field,
                        beast::lexicalCastThrow <std::uint8_t>(strValue));
                }
            }
            else if (value.isInt ())
            {
                if (value.asInt () < minValue || value.asInt () > maxValue)
                {
                    error = out_of_range (json_name, fieldName);
                    return ret;
                }

                ret = detail::make_stvar <STUInt8> (field,
                    static_cast <std::uint8_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                if (value.asUInt () > maxValue)
                {
                    error = out_of_range (json_name, fieldName);
                    return ret;
                }

                ret = detail::make_stvar <STUInt8> (field,
                    static_cast <std::uint8_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }
        break;

    case STI_UINT16:
        try
        {
            if (value.isString ())
            {
                std::string const strValue = value.asString ();

                if (! strValue.empty () &&
                    ((strValue[0] < '0') || (strValue[0] > '9')))
                {
                    if (field == sfTransactionType)
                    {
                        TxType const txType (TxFormats::getInstance().
                            findTypeByName (strValue));

                        ret = detail::make_stvar <STUInt16> (field,
                            static_cast <std::uint16_t> (txType));

                        if (*name == sfGeneric)
                            name = &sfTransaction;
                    }
                    else if (field == sfLedgerEntryType)
                    {
                        LedgerEntryType const type (
                            LedgerFormats::getInstance().
                                findTypeByName (strValue));

                        ret = detail::make_stvar <STUInt16> (field,
                            static_cast <std::uint16_t> (type));

                        if (*name == sfGeneric)
                            name = &sfLedgerEntry;
                    }
                    else
                    {
                        error = invalid_data (json_name, fieldName);
                        return ret;
                    }
                }
                else
                {
                    ret = detail::make_stvar <STUInt16> (field,
                        beast::lexicalCastThrow <std::uint16_t> (strValue));
                }
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt16> (field,
                    to_unsigned <std::uint16_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt16> (field,
                    to_unsigned <std::uint16_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_UINT32:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    beast::lexicalCastThrow <std::uint32_t> (
                        value.asString ()));
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    to_unsigned <std::uint32_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    static_cast <std::uint32_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_UINT64:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    uintFromHex (value.asString ()));
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    to_unsigned<std::uint64_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    static_cast <std::uint64_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH128:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash128> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH160:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash160> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH256:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash256> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_VL:
        if (! value.isString ())
        {
            error = bad_type (json_name, fieldName);
            return ret;
        }

        try
        {
            std::pair<Blob, bool> vBlob (strUnHex (value.asString ()));

            if (! vBlob.second)
                Throw<std::invalid_argument> ("invalid data");

            ret = detail::make_stvar <STBlob> (field, vBlob.first.data (),
                                             vBlob.first.size ());
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_AMOUNT:
        try
        {
            ret = detail::make_stvar <STAmount> (amountFromJson (field, value));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_VECTOR256:
        if (! value.isArray ())
        {
            error = array_expected (json_name, fieldName);
            return ret;
        }

        try
        {
            STVector256 tail (field);
            for (Json::UInt i = 0; value.isValidIndex (i); ++i)
            {
                uint256 s;
                s.SetHex (value[i].asString ());
                tail.push_back (s);
            }
            ret = detail::make_stvar <STVector256> (std::move (tail));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_PATHSET:
        if (!value.isArray ())
        {
            error = array_expected (json_name, fieldName);
            return ret;
        }

        try
        {
            STPathSet tail (field);

            for (Json::UInt i = 0; value.isValidIndex (i); ++i)
            {
                STPath p;

                if (!value[i].isArray ())
                {
                    std::stringstream ss;
                    ss << fieldName << "[" << i << "]";
                    error = array_expected (json_name, ss.str ());
                    return ret;
                }

                for (Json::UInt j = 0; value[i].isValidIndex (j); ++j)
                {
                    std::stringstream ss;
                    ss << fieldName << "[" << i << "][" << j << "]";
                    std::string const element_name (
                        json_name + "." + ss.str());

                    // each element in this path has some combination of
                    // account, currency, or issuer

                    Json::Value pathEl = value[i][j];

                    if (!pathEl.isObject ())
                    {
                        error = not_an_object (element_name);
                        return ret;
                    }

                    Json::Value const& account  = pathEl["account"];
                    Json::Value const& currency = pathEl["currency"];
                    Json::Value const& issuer   = pathEl["issuer"];
                    bool hasCurrency            = false;
                    AccountID uAccount, uIssuer;
                    Currency uCurrency;

                    if (account)
                    {
                        // human account id
                        if (! account.isString ())
                        {
                            error = string_expected (element_name, "account");
                            return ret;
                        }

                        // If we have what looks like a 160-bit hex value, we
                        // set it, otherwise, we assume it's an AccountID
                        if (!uAccount.SetHexExact (account.asString ()))
                        {
                            auto const a = parseBase58<AccountID>(
                                account.asString());
                            if (! a)
                            {
                                error = invalid_data (element_name, "account");
                                return ret;
                            }
                            uAccount = *a;
                        }
                    }

                    if (currency)
                    {
                        // human currency
                        if (!currency.isString ())
                        {
                            error = string_expected (element_name, "currency");
                            return ret;
                        }

                        hasCurrency = true;

                        if (!uCurrency.SetHexExact (currency.asString ()))
                        {
                            if (!to_currency (uCurrency, currency.asString ()))
                            {
                                error = invalid_data (element_name, "currency");
                                return ret;
                            }
                        }
                    }

                    if (issuer)
                    {
                        // human account id
                        if (!issuer.isString ())
                        {
                            error = string_expected (element_name, "issuer");
                            return ret;
                        }

                        if (!uIssuer.SetHexExact (issuer.asString ()))
                        {
                            auto const a = parseBase58<AccountID>(
                                issuer.asString());
                            if (! a)
                            {
                                error = invalid_data (element_name, "issuer");
                                return ret;
                            }
                            uIssuer = *a;
                        }
                    }

                    p.emplace_back (uAccount, uCurrency, uIssuer, hasCurrency);
                }

                tail.push_back (p);
            }
            ret = detail::make_stvar <STPathSet> (std::move (tail));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_ACCOUNT:
        {
            if (! value.isString ())
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }

            std::string const strValue = value.asString ();

            try
            {
                // VFALCO This needs careful auditing
                auto const account =
                    parseHexOrBase58<AccountID>(
                        strValue);
                if (! account)
                {
                    error = invalid_data (json_name, fieldName);
                    return ret;
                }
                ret = detail::make_stvar <STAccount>(
                    field, *account);
            }
            catch (std::exception const&)
            {
                error = invalid_data (json_name, fieldName);
                return ret;
            }
        }
        break;

    default:
        error = bad_type (json_name, fieldName);
        return ret;
    }

    return ret;
}